

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::exceptionsThrow(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  errorCodes ec;
  uint uVar1;
  uint uVar2;
  ForthStack<unsigned_int> *this_01;
  allocator<char> local_51;
  string local_50;
  
  this_00 = &this->dStack;
  ec = ForthStack<unsigned_int>::getTop(this_00);
  if (ec == ~errorAbort) {
    ForthStack<unsigned_int>::pop(this_00);
    return;
  }
  uVar1 = this->exceptionHandler;
  if ((4 < uVar1) && (uVar2 = (this->catchStack).top, 4 < uVar2)) {
    this_01 = &this->catchStack;
    while (uVar1 < uVar2) {
      ForthStack<unsigned_int>::pop(this_01);
      uVar2 = (this->catchStack).top;
      uVar1 = this->exceptionHandler;
    }
    uVar1 = ForthStack<unsigned_int>::getTop(this_01);
    this->exceptionHandler = uVar1;
    ForthStack<unsigned_int>::pop(this_01);
    uVar1 = ForthStack<unsigned_int>::getTop(this_01);
    ForthStack<unsigned_int>::pop(this_01);
    if ((ulong)uVar1 <
        (ulong)(((long)(this->savedInput).
                       super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->savedInput).
                      super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x50)) {
      std::
      vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
      ::resize(&this->savedInput,(ulong)(uVar1 + 1));
      RestoreInput(this);
    }
    uVar1 = ForthStack<unsigned_int>::getTop(this_01);
    ForthStack<unsigned_int>::pop(this_01);
    while (uVar1 < (this->returnStack).top) {
      ForthStack<unsigned_int>::pop(&this->returnStack);
    }
    uVar1 = ForthStack<unsigned_int>::getTop(this_01);
    ForthStack<unsigned_int>::pop(this_01);
    while (uVar2 = (this->rStack).top, uVar1 < uVar2) {
      ForthStack<unsigned_int>::pop(&this->rStack);
    }
    while (uVar2 < uVar1) {
      ForthStack<unsigned_int>::push(&this->rStack,0);
      uVar2 = (this->rStack).top;
    }
    uVar1 = ForthStack<unsigned_int>::getTop(this_01);
    do {
      ForthStack<unsigned_int>::pop(this_01);
      uVar2 = (this->dStack).top;
      this_01 = this_00;
    } while (uVar1 < uVar2);
    while (uVar2 < uVar1) {
      ForthStack<unsigned_int>::push(this_00,0);
      uVar2 = (this->dStack).top;
    }
    returnStackRestore(this);
    ForthStack<unsigned_int>::push(this_00,ec);
    return;
  }
  if (ec == errorAbort) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    throwCppExceptionMessage(this,&local_50,errorAbort);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  throwCppExceptionMessage(this,&local_50,ec);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void exceptionsThrow(){
			SCell exceptionNumber = static_cast<SCell>(dStack.getTop()); 
			if (exceptionNumber != 0){
				if (exceptionHandler >= 5 && catchStack.stackDepth() >= 5){
					while (catchStack.stackDepth() > exceptionHandler) catchStack.pop();
					exceptionHandler = catchStack.getTop(); catchStack.pop();
					auto sourceSaveDepth = catchStack.getTop(); catchStack.pop();
					if (sourceSaveDepth < savedInput.size()) {
						savedInput.resize(sourceSaveDepth + 1);
						RestoreInput();
					}
					auto returnDepth = catchStack.getTop(); catchStack.pop();
					while (returnStack.stackDepth() > returnDepth) returnStack.pop();
					auto rDepth = catchStack.getTop(); catchStack.pop();
					while (rStack.stackDepth() > rDepth) rStack.pop();
					while (rStack.stackDepth() < rDepth) rStack.push(0);
					auto dDepth = catchStack.getTop(); catchStack.pop();
					while (dStack.stackDepth() > dDepth) dStack.pop();
					while (dStack.stackDepth() < dDepth) dStack.push(0);

					returnStackRestore();
					dStack.push(exceptionNumber);
				}
				else {
					if (exceptionNumber == -1){
						throwCppExceptionMessage("",static_cast<Forth::errorCodes>(exceptionNumber));
					}
					throwCppExceptionMessage("",static_cast<Forth::errorCodes>(exceptionNumber));
				}
			}
			else {
				dStack.pop();
			}
		}